

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexInternalShape.cpp
# Opt level: O2

void __thiscall
cbtConvexInternalShape::getAabbSlow
          (cbtConvexInternalShape *this,cbtTransform *trans,cbtVector3 *minAabb,cbtVector3 *maxAabb)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int i;
  long lVar6;
  float in_XMM0_Da;
  undefined1 auVar7 [16];
  undefined1 auVar12 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined8 uVar13;
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar14;
  cbtVector3 sv;
  undefined1 local_88 [16];
  cbtVector3 local_78;
  undefined1 local_60 [16];
  cbtVector3 local_50;
  cbtVector3 local_40;
  
  (*(this->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])();
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    auVar12 = ZEXT856(0);
    local_78.m_floats[0] = 0.0;
    local_78.m_floats[1] = 0.0;
    local_78.m_floats[2] = 0.0;
    local_78.m_floats[3] = 0.0;
    local_78.m_floats[lVar6] = 1.0;
    cVar14 = ::operator*(&local_78,&trans->m_basis);
    uVar13 = cVar14.m_floats._8_8_;
    auVar8._0_8_ = cVar14.m_floats._0_8_;
    auVar8._8_56_ = auVar12;
    auVar7._8_8_ = in_XMM1_Qb;
    auVar7._0_8_ = uVar13;
    auVar7 = vmovlhps_avx(auVar8._0_16_,auVar7);
    local_88 = auVar7;
    (*(this->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
              (this,local_88);
    auVar1._8_8_ = in_XMM1_Qb;
    auVar1._0_8_ = uVar13;
    local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar7,auVar1);
    auVar12 = ZEXT856(local_40.m_floats._8_8_);
    cVar14 = cbtTransform::operator()(trans,&local_40);
    auVar9._0_8_ = cVar14.m_floats._0_8_;
    auVar9._8_56_ = auVar12;
    auVar2._8_8_ = in_XMM1_Qb;
    auVar2._0_8_ = cVar14.m_floats._8_8_;
    local_88 = vmovlhps_avx(auVar9._0_16_,auVar2);
    auVar12 = (undefined1  [56])0x0;
    maxAabb->m_floats[lVar6] = in_XMM0_Da + *(float *)(local_88 + lVar6 * 4);
    local_78.m_floats[lVar6] = -1.0;
    cVar14 = ::operator*(&local_78,&trans->m_basis);
    uVar13 = cVar14.m_floats._8_8_;
    auVar10._0_8_ = cVar14.m_floats._0_8_;
    auVar10._8_56_ = auVar12;
    auVar3._8_8_ = in_XMM1_Qb;
    auVar3._0_8_ = uVar13;
    auVar7 = vmovlhps_avx(auVar10._0_16_,auVar3);
    local_60 = auVar7;
    (*(this->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
              (this,local_60);
    auVar4._8_8_ = in_XMM1_Qb;
    auVar4._0_8_ = uVar13;
    local_50.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar7,auVar4);
    auVar12 = ZEXT856(local_50.m_floats._8_8_);
    cVar14 = cbtTransform::operator()(trans,&local_50);
    auVar11._0_8_ = cVar14.m_floats._0_8_;
    auVar11._8_56_ = auVar12;
    auVar5._8_8_ = in_XMM1_Qb;
    auVar5._0_8_ = cVar14.m_floats._8_8_;
    local_88 = vmovlhps_avx(auVar11._0_16_,auVar5);
    minAabb->m_floats[lVar6] = *(float *)(local_88 + lVar6 * 4) - in_XMM0_Da;
  }
  return;
}

Assistant:

void cbtConvexInternalShape::getAabbSlow(const cbtTransform& trans, cbtVector3& minAabb, cbtVector3& maxAabb) const
{
#ifndef __SPU__
	//use localGetSupportingVertexWithoutMargin?
	cbtScalar margin = getMargin();
	for (int i = 0; i < 3; i++)
	{
		cbtVector3 vec(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
		vec[i] = cbtScalar(1.);

		cbtVector3 sv = localGetSupportingVertex(vec * trans.getBasis());

		cbtVector3 tmp = trans(sv);
		maxAabb[i] = tmp[i] + margin;
		vec[i] = cbtScalar(-1.);
		tmp = trans(localGetSupportingVertex(vec * trans.getBasis()));
		minAabb[i] = tmp[i] - margin;
	}
#endif
}